

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausSelectClauses(Clu_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int *__s;
  uint local_2c;
  int local_28;
  int c;
  int i;
  int CostMax;
  int Cost;
  int nClauCount;
  int *pCostCount;
  Clu_Man_t *p_local;
  
  iVar1 = Vec_IntSize(p->vClauses);
  if (iVar1 <= p->nClausesMax) {
    __assert_fail("Vec_IntSize(p->vClauses) > p->nClausesMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                  ,0x161,"int Fra_ClausSelectClauses(Clu_Man_t *)");
  }
  local_2c = p->nSimWords * 0x20;
  uVar2 = local_2c + 1;
  __s = (int *)malloc((long)(int)uVar2 << 2);
  memset(__s,0,(long)(int)uVar2 << 2);
  for (local_28 = 0; iVar1 = Vec_IntSize(p->vCosts), local_28 < iVar1; local_28 = local_28 + 1) {
    iVar1 = Vec_IntEntry(p->vCosts,local_28);
    if (iVar1 != -1) {
      if ((int)uVar2 <= iVar1) {
        __assert_fail("Cost < CostMax",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                      ,0x16a,"int Fra_ClausSelectClauses(Clu_Man_t *)");
      }
      __s[iVar1] = __s[iVar1] + 1;
    }
  }
  if (*__s != 0) {
    __assert_fail("pCostCount[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                  ,0x16d,"int Fra_ClausSelectClauses(Clu_Man_t *)");
  }
  CostMax = 0;
  for (; 0 < (int)local_2c; local_2c = local_2c - 1) {
    if (__s[(int)local_2c] < 0) {
      __assert_fail("pCostCount[c] >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                    ,0x172,"int Fra_ClausSelectClauses(Clu_Man_t *)");
    }
    CostMax = __s[(int)local_2c] + CostMax;
    if (p->nClausesMax <= CostMax) break;
  }
  CostMax = 0;
  for (local_28 = 0; iVar1 = Vec_IntSize(p->vCosts), local_28 < iVar1; local_28 = local_28 + 1) {
    iVar1 = Vec_IntEntry(p->vCosts,local_28);
    if ((iVar1 < (int)local_2c) || (p->nClausesMax <= CostMax)) {
      Vec_IntWriteEntry(p->vCosts,local_28,-1);
    }
    else {
      CostMax = CostMax + 1;
    }
  }
  if (__s != (int *)0x0) {
    free(__s);
  }
  p->nClauses = CostMax;
  if (p->fVerbose != 0) {
    printf("Selected %d clauses. Cost range: [%d < %d < %d]\n",(ulong)(uint)CostMax,1,
           (ulong)local_2c,(ulong)uVar2);
  }
  return local_2c;
}

Assistant:

int Fra_ClausSelectClauses( Clu_Man_t * p )
{
    int * pCostCount, nClauCount, Cost, CostMax, i, c;
    assert( Vec_IntSize(p->vClauses) > p->nClausesMax );   
    // count how many implications have each cost
    CostMax = p->nSimWords * 32 + 1;
    pCostCount = ABC_ALLOC( int, CostMax );
    memset( pCostCount, 0, sizeof(int) * CostMax );
    Vec_IntForEachEntry( p->vCosts, Cost, i )
    {
        if ( Cost == -1 )
            continue;
        assert( Cost < CostMax );
        pCostCount[ Cost ]++;
    }
    assert( pCostCount[0] == 0 );
    // select the bound on the cost (above this bound, implication will be included)
    nClauCount = 0;
    for ( c = CostMax - 1; c > 0; c-- )
    {
        assert( pCostCount[c] >= 0 );
        nClauCount += pCostCount[c];
        if ( nClauCount >= p->nClausesMax )
            break;
    }
    // collect implications with the given costs
    nClauCount = 0;
    Vec_IntForEachEntry( p->vCosts, Cost, i )
    {
        if ( Cost >= c && nClauCount < p->nClausesMax )
        {
            nClauCount++;
            continue;
        }
        Vec_IntWriteEntry( p->vCosts, i, -1 );
    }
    ABC_FREE( pCostCount );
    p->nClauses = nClauCount;
if ( p->fVerbose )
printf( "Selected %d clauses. Cost range: [%d < %d < %d]\n", nClauCount, 1, c, CostMax );
    return c;
}